

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t read_eocd(zip *zip,char *p,int64_t current_offset)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int64_t current_offset_local;
  char *p_local;
  zip *zip_local;
  
  uVar1 = archive_le16dec(p + 4);
  if (uVar1 == 0) {
    uVar1 = archive_le16dec(p + 4);
    uVar2 = archive_le16dec(p + 6);
    if (uVar1 == uVar2) {
      uVar1 = archive_le16dec(p + 10);
      uVar2 = archive_le16dec(p + 8);
      if (uVar1 == uVar2) {
        uVar3 = archive_le32dec(p + 0x10);
        uVar4 = archive_le32dec(p + 0xc);
        if (current_offset < (long)(ulong)(uVar3 + uVar4)) {
          zip_local._4_4_ = L'\0';
        }
        else {
          uVar3 = archive_le32dec(p + 0x10);
          zip->central_directory_offset = (ulong)uVar3;
          zip_local._4_4_ = L' ';
        }
      }
      else {
        zip_local._4_4_ = L'\0';
      }
    }
    else {
      zip_local._4_4_ = L'\0';
    }
  }
  else {
    zip_local._4_4_ = L'\0';
  }
  return zip_local._4_4_;
}

Assistant:

static int
read_eocd(struct zip *zip, const char *p, int64_t current_offset)
{
	/* Sanity-check the EOCD we've found. */

	/* This must be the first volume. */
	if (archive_le16dec(p + 4) != 0)
		return 0;
	/* Central directory must be on this volume. */
	if (archive_le16dec(p + 4) != archive_le16dec(p + 6))
		return 0;
	/* All central directory entries must be on this volume. */
	if (archive_le16dec(p + 10) != archive_le16dec(p + 8))
		return 0;
	/* Central directory can't extend beyond start of EOCD record. */
	if (archive_le32dec(p + 16) + archive_le32dec(p + 12)
	    > current_offset)
		return 0;

	/* Save the central directory location for later use. */
	zip->central_directory_offset = archive_le32dec(p + 16);

	/* This is just a tiny bit higher than the maximum
	   returned by the streaming Zip bidder.  This ensures
	   that the more accurate seeking Zip parser wins
	   whenever seek is available. */
	return 32;
}